

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downcast.cpp
# Opt level: O3

void C_A_T_C_H_T_E_S_T_0(void)

{
  SourceLineInfo *pSVar1;
  ITransientExpression *pIVar2;
  undefined1 *puVar3;
  undefined4 uVar4;
  _func_int **pp_Var5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  AssertionHandler catchAssertionHandler_120;
  type t1;
  type t2;
  AssertionHandler catchAssertionHandler;
  convert_a a;
  convert_b b;
  convert_c c;
  convert_b b_1;
  istringstream in;
  AssertionHandler local_c80;
  undefined1 local_c38 [8];
  undefined8 local_c30;
  undefined1 local_c28 [24];
  _Alloc_hider local_c10;
  undefined1 local_b98 [8];
  undefined1 local_b90 [8];
  ITransientExpression *local_b88;
  _func_int **local_b80;
  bool bStack_b78;
  bool bStack_b77;
  undefined6 uStack_b76;
  char *local_b70;
  ITransientExpression local_b68;
  _func_int *local_b58 [2];
  SectionInfo local_b48;
  ios_base local_ad8 [264];
  ITransientExpression local_9d0;
  undefined1 local_9bc [8];
  char local_9b4 [4];
  undefined1 local_9b0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_980 [4];
  ios_base local_938 [264];
  StringRef local_830;
  StringRef local_820;
  StringRef local_810;
  StringRef local_800;
  StringRef local_7f0;
  StringRef local_7e0;
  StringRef local_7d0;
  StringRef local_7c0;
  StringRef local_7b0;
  StringRef local_7a0;
  StringRef local_790;
  StringRef local_780;
  StringRef local_770;
  StringRef local_760;
  StringRef local_750;
  StringRef local_740;
  StringRef local_730;
  StringRef local_720;
  StringRef local_710;
  StringRef local_700;
  StringRef local_6f0;
  StringRef local_6e0;
  StringRef local_6d0;
  StringRef local_6c0;
  StringRef local_6b0;
  StringRef local_6a0;
  StringRef local_690;
  StringRef local_680;
  StringRef local_670;
  StringRef local_660;
  StringRef local_650;
  StringRef local_640;
  StringRef local_630;
  StringRef local_620;
  StringRef local_610;
  StringRef local_600;
  StringRef local_5f0;
  StringRef local_5e0;
  StringRef local_5d0;
  StringRef local_5c0;
  StringRef local_5b0;
  StringRef local_5a0;
  StringRef local_590;
  StringRef local_580;
  StringRef local_570;
  StringRef local_560;
  StringRef local_550;
  StringRef local_540;
  StringRef local_530;
  StringRef local_520;
  StringRef local_510;
  StringRef local_500;
  StringRef local_4f0;
  StringRef local_4e0;
  StringRef local_4d0;
  StringRef local_4c0;
  StringRef local_4b0;
  StringRef local_4a0;
  StringRef local_490;
  StringRef local_480;
  StringRef local_470;
  StringRef local_460;
  StringRef local_450;
  StringRef local_440;
  StringRef local_430;
  StringRef local_420;
  StringRef local_410;
  StringRef local_400;
  StringRef local_3f0;
  StringRef local_3e0;
  StringRef local_3d0;
  StringRef local_3c0;
  StringRef local_3b0;
  StringRef local_3a0;
  StringRef local_390;
  StringRef local_380;
  StringRef local_370;
  StringRef local_360;
  StringRef local_350;
  StringRef local_340;
  StringRef local_330;
  StringRef local_320;
  StringRef local_310;
  StringRef local_300;
  StringRef local_2f0;
  StringRef local_2e0;
  StringRef local_2d0;
  StringRef local_2c0;
  StringRef local_2b0;
  StringRef local_2a0;
  StringRef local_290;
  StringRef local_280;
  StringRef local_270;
  StringRef local_260;
  StringRef local_250;
  StringRef local_240;
  StringRef local_230;
  StringRef local_220;
  StringRef local_210;
  StringRef local_200;
  StringRef local_1f0;
  StringRef local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  StringRef local_1b0;
  StringRef local_1a0;
  StringRef local_190;
  StringRef local_180;
  StringRef local_170;
  StringRef local_160;
  StringRef local_150;
  StringRef local_140;
  StringRef local_130;
  StringRef local_120;
  StringRef local_110;
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  StringRef local_d0;
  StringRef local_c0;
  StringRef local_b0;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1f;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"general","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x28;
    Catch::StringRef::StringRef(&local_40,"t1 == t2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_40,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x29;
    Catch::StringRef::StringRef(&local_50,"t1 == std::move(t2)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_50,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303b0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x2a;
    Catch::StringRef::StringRef(&local_60,"std::move(t1) == t2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_60,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303b0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x2b;
    Catch::StringRef::StringRef(&local_70,"std::move(t1) == std::move(t2)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_70,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303b0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression._4_4_ << 0x20);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x33;
    Catch::StringRef::StringRef(&local_80,"t1 == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_80,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x34;
    Catch::StringRef::StringRef(&local_90,"t1 == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_90,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x35;
    Catch::StringRef::StringRef(&local_a0,"std::move(t1) == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_a0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x36;
    Catch::StringRef::StringRef(&local_b0,"std::move(t1) == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_b0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002303f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x38;
    Catch::StringRef::StringRef(&local_c0,"a == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_c0,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230430;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x39;
    Catch::StringRef::StringRef(&local_d0,"std::move(a) == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_d0,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230430;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x3a;
    Catch::StringRef::StringRef(&local_e0,"a == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_e0,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230430;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x3b;
    Catch::StringRef::StringRef(&local_f0,"std::move(a) == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_f0,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230430;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x46;
    Catch::StringRef::StringRef(&local_100,"t1 == b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_100,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230470;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x47;
    Catch::StringRef::StringRef(&local_110,"t1 == std::move(b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_110,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230470;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x48;
    Catch::StringRef::StringRef(&local_120,"std::move(t1) == b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_120,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230470;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x49;
    Catch::StringRef::StringRef(&local_130,"std::move(t1) == std::move(b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_130,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230470;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x4b;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"general mixed","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x57;
    Catch::StringRef::StringRef(&local_140,"t1 == i");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_140,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == uVar4;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x58;
    Catch::StringRef::StringRef(&local_150,"t1 == std::move(i)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_150,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == uVar4;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x59;
    Catch::StringRef::StringRef(&local_160,"std::move(t1) == i");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_160,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == uVar4;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x5a;
    Catch::StringRef::StringRef(&local_170,"std::move(t1) == std::move(i)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_170,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == uVar4;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x65;
    Catch::StringRef::StringRef(&local_180,"t1 == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_180,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x66;
    Catch::StringRef::StringRef(&local_190,"t1 == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_190,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x67;
    Catch::StringRef::StringRef(&local_1a0,"std::move(t1) == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1a0,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x68;
    Catch::StringRef::StringRef(&local_1b0,"std::move(t1) == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1b0,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = iVar8 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002304f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x6a;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"general mixed + non mixed","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x75;
    Catch::StringRef::StringRef(&local_1c0,"t1 == t2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1c0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230530;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x76;
    Catch::StringRef::StringRef(&local_1d0,"t1 == std::move(t2)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1d0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230530;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x77;
    Catch::StringRef::StringRef(&local_1e0,"std::move(t1) == t2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1e0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230530;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x78;
    Catch::StringRef::StringRef(&local_1f0,"std::move(t1) == std::move(t2)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_1f0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230530;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x80;
    Catch::StringRef::StringRef(&local_200,"t1 == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_200,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230570;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x81;
    Catch::StringRef::StringRef(&local_210,"t1 == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_210,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230570;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x82;
    Catch::StringRef::StringRef(&local_220,"std::move(t1) == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_220,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230570;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x83;
    Catch::StringRef::StringRef(&local_230,"std::move(t1) == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_230,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_9d0._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230570;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x85;
    Catch::StringRef::StringRef(&local_240,"a == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_240,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x86;
    Catch::StringRef::StringRef(&local_250,"std::move(a) == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_250,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x87;
    Catch::StringRef::StringRef(&local_260,"a == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_260,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x88;
    Catch::StringRef::StringRef(&local_270,"std::move(a) == std::move(a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_270,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x93;
    Catch::StringRef::StringRef(&local_280,"t1 == b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_280,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9b4;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x94;
    Catch::StringRef::StringRef(&local_290,"t1 == std::move(b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_290,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9b4;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x95;
    Catch::StringRef::StringRef(&local_2a0,"std::move(t1) == b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2a0,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9b4;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x96;
    Catch::StringRef::StringRef(&local_2b0,"std::move(t1) == std::move(b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2b0,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002305f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9b4;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_9bc._0_4_ = 0;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x9a;
    Catch::StringRef::StringRef(&local_2c0,"t1 == i");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2c0,Normal);
    uVar6 = local_9bc._0_4_;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == uVar6;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230630;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x9b;
    Catch::StringRef::StringRef(&local_2d0,"t1 == std::move(i)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2d0,Normal);
    uVar6 = local_9bc._0_4_;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == uVar6;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230630;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x9c;
    Catch::StringRef::StringRef(&local_2e0,"std::move(t1) == i");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2e0,Normal);
    uVar6 = local_9bc._0_4_;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == uVar6;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230630;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x9d;
    Catch::StringRef::StringRef(&local_2f0,"std::move(t1) == std::move(i)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_2f0,Normal);
    uVar6 = local_9bc._0_4_;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == uVar6;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230630;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xa8;
    Catch::StringRef::StringRef(&local_300,"t1 == c");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_300,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230670;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    pIVar2 = (ITransientExpression *)(local_9bc + 7);
    local_c10._M_p = (pointer)pIVar2;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xa9;
    Catch::StringRef::StringRef(&local_310,"t1 == std::move(c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_310,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230670;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)pIVar2;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xaa;
    Catch::StringRef::StringRef(&local_320,"std::move(t1) == c");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_320,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230670;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)pIVar2;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xab;
    Catch::StringRef::StringRef(&local_330,"std::move(t1) == std::move(c)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_330,Normal);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230670;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)pIVar2;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0xad;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"equality_comparison","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xb9;
    Catch::StringRef::StringRef(&local_340,"a == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_340,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002306b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xba;
    Catch::StringRef::StringRef(&local_350,"a == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_350,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002306f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xbb;
    Catch::StringRef::StringRef(&local_360,"0 == a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_360,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230730;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xbc;
    Catch::StringRef::StringRef(&local_370,"!(a == b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_370,Normal);
    local_c38[0] = local_b98._0_4_ != (int)local_b68._vptr_ITransientExpression;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xbe;
    Catch::StringRef::StringRef(&local_380,"a != b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_380,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"!=");
    local_c30._1_1_ = uVar4 != iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002306b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xbf;
    Catch::StringRef::StringRef(&local_390,"a != 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_390,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"!=");
    local_c30._1_1_ = uVar4 != 1;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002306f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xc0;
    Catch::StringRef::StringRef(&local_3a0,"1 != a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3a0,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"!=");
    local_c30._1_1_ = uVar4 != 1;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230730;
    local_c28._0_8_ = &local_9d0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xc1;
    Catch::StringRef::StringRef(&local_3b0,"!(a != a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3b0,Normal);
    local_c38[0] = 1;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0xc3;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"relational_comparison","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xcf;
    Catch::StringRef::StringRef(&local_3c0,"a < b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3c0,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<");
    local_c30._1_1_ = (int)uVar4 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd0;
    Catch::StringRef::StringRef(&local_3d0,"0 < b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3d0,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<");
    local_c30._1_1_ = 0 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307b0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    local_c28._0_8_ = &local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd1;
    Catch::StringRef::StringRef(&local_3e0,"a < 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3e0,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<");
    local_c30._1_1_ = (int)uVar4 < 1;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd2;
    Catch::StringRef::StringRef(&local_3f0,"!(b < a)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_3f0,Normal);
    local_c38[0] = (int)local_b98._0_4_ <= (int)local_b68._vptr_ITransientExpression;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd3;
    Catch::StringRef::StringRef(&local_400,"a <= b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_400,Normal);
    uVar4 = local_b98._0_4_;
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<=");
    local_c30._1_1_ = (int)uVar4 <= iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd4;
    Catch::StringRef::StringRef(&local_410,"a <= 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_410,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<=");
    local_c30._1_1_ = (int)uVar4 < 2;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307f0;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd5;
    Catch::StringRef::StringRef(&local_420,"1 <= b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_420,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<=");
    local_c30._1_1_ = 0 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307b0;
    local_c28._0_8_ = &local_9d0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd6;
    Catch::StringRef::StringRef(&local_430,"a <= a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_430,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"<=");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._0_8_ = local_b98;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_c28._0_8_;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd7;
    Catch::StringRef::StringRef(&local_440,"b > a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_440,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">");
    local_c30._1_1_ = (int)uVar4 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._0_8_ = &local_b68;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd8;
    Catch::StringRef::StringRef(&local_450,"1 > a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_450,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">");
    local_c30._1_1_ = (int)uVar4 < 1;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307b0;
    local_c28._0_8_ = &local_9d0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xd9;
    Catch::StringRef::StringRef(&local_460,"b > 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_460,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">");
    local_c30._1_1_ = 0 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307f0;
    local_c28._0_8_ = &local_b68;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xda;
    Catch::StringRef::StringRef(&local_470,"!(a > b)");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_470,Normal);
    local_c38[0] = (int)local_b98._0_4_ <= (int)local_b68._vptr_ITransientExpression;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xdb;
    Catch::StringRef::StringRef(&local_480,"b >= a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_480,Normal);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">=");
    local_c30._1_1_ = (int)uVar4 <= iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._0_8_ = &local_b68;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xdc;
    Catch::StringRef::StringRef(&local_490,"b >= 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_490,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)((ulong)local_9d0._vptr_ITransientExpression & 0xffffffff00000000);
    iVar8 = (int)local_b68._vptr_ITransientExpression;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">=");
    local_c30._1_1_ = -1 < iVar8;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307f0;
    local_c28._0_8_ = &local_b68;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xdd;
    Catch::StringRef::StringRef(&local_4a0,"1 >= a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4a0,Normal);
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,">=");
    local_c30._1_1_ = (int)uVar4 < 2;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002307b0;
    local_c28._0_8_ = &local_9d0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = local_b98;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xde;
    Catch::StringRef::StringRef(&local_4b0,"b >= b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4b0,Normal);
    Catch::StringRef::StringRef((StringRef *)&local_c80,">=");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230770;
    local_c28._0_8_ = &local_b68;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c10._M_p = (pointer)local_c28._0_8_;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0xe0;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"addition","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xed;
    Catch::StringRef::StringRef(&local_4c0,"static_cast<int>(a) == 3");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4c0,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0xf3;
    Catch::StringRef::StringRef(&local_4d0,"static_cast<int>(b) == 3");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4d0,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  paVar9 = &local_b48.name.field_2;
  paVar10 = &local_b48.description.field_2;
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0xf5;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"addition with other strong_typedef","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != paVar10) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x105;
    Catch::StringRef::StringRef(&local_4e0,"static_cast<int>(b) == 10");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4e0,Normal);
    local_b98._0_4_ = 10;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,10);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x113;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"subtraction","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != paVar10) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x120;
    Catch::StringRef::StringRef(&local_4f0,"static_cast<int>(a) == 3");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_4f0,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x126;
    Catch::StringRef::StringRef(&local_500,"static_cast<int>(b) == 3");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_500,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x128;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"subtraction noncommutative","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x135;
    Catch::StringRef::StringRef(&local_510,"static_cast<int>(a) == 3");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_510,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x13a;
    Catch::StringRef::StringRef(&local_520,"static_cast<int>(b) == -2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_520,Normal);
    local_b98._0_4_ = 0xfffffffe;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xfffffffe);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x13e;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"multiplication","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x14b;
    Catch::StringRef::StringRef(&local_530,"static_cast<int>(a) == 8");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_530,Normal);
    local_b98._0_4_ = 8;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,8);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x151;
    Catch::StringRef::StringRef(&local_540,"static_cast<int>(b) == 8");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_540,Normal);
    local_b98._0_4_ = 8;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,8);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x153;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"division","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x160;
    Catch::StringRef::StringRef(&local_550,"static_cast<int>(a) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_550,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x166;
    Catch::StringRef::StringRef(&local_560,"static_cast<int>(b) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_560,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x168;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"division noncommutative","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x175;
    Catch::StringRef::StringRef(&local_570,"static_cast<int>(a) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_570,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x17a;
    Catch::StringRef::StringRef(&local_580,"static_cast<int>(b) == 2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_580,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x17f;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"modulo","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x18c;
    Catch::StringRef::StringRef(&local_590,"static_cast<int>(a) == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_590,Normal);
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x192;
    Catch::StringRef::StringRef(&local_5a0,"static_cast<int>(b) == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5a0,Normal);
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x194;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"increment","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x19c;
    Catch::StringRef::StringRef(&local_5b0,"static_cast<int>(++a) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5b0,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x19d;
    Catch::StringRef::StringRef(&local_5c0,"static_cast<int>(a++) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5c0,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x19e;
    Catch::StringRef::StringRef(&local_5d0,"static_cast<int>(a) == 2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5d0,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1a0;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"decrement","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1a8;
    Catch::StringRef::StringRef(&local_5e0,"static_cast<int>(--a) == -1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5e0,Normal);
    local_b98._0_4_ = 0xffffffff;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xffffffff);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1a9;
    Catch::StringRef::StringRef(&local_5f0,"static_cast<int>(a--) == -1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_5f0,Normal);
    local_b98._0_4_ = 0xffffffff;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xffffffff);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1aa;
    Catch::StringRef::StringRef(&local_600,"static_cast<int>(a) == -2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_600,Normal);
    local_b98._0_4_ = 0xfffffffe;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xfffffffe);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1ac;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"unary","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1b6;
    Catch::StringRef::StringRef(&local_610,"static_cast<int>(+a) == 2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_610,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1b7;
    Catch::StringRef::StringRef(&local_620,"static_cast<int>(-a) == -2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_620,Normal);
    local_b98._0_4_ = 0xfffffffe;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xfffffffe);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1b9;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"complement","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1c1;
    Catch::StringRef::StringRef(&local_630,"static_cast<unsigned>(~a) == ~1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_630,Normal);
    local_b98._0_4_ = 0xfffffffe;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xfffffffe);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1c4;
    Catch::StringRef::StringRef(&local_640,"static_cast<unsigned>(~b) == ~42u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_640,Normal);
    local_b98._0_4_ = 0xffffffd5;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,0xffffffd5);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1c6;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"bitwise","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1d2;
    Catch::StringRef::StringRef(&local_650,"static_cast<unsigned>(a | type(3u)) == 3u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_650,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1d3;
    Catch::StringRef::StringRef(&local_660,"static_cast<unsigned>(type(3u) | a) == 3u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_660,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1d5;
    Catch::StringRef::StringRef(&local_670,"static_cast<unsigned>(a) == 3u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_670,Normal);
    local_b98._0_4_ = 3;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,3);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1d7;
    Catch::StringRef::StringRef(&local_680,"static_cast<unsigned>(a & type(2u)) == 2u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_680,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1d8;
    Catch::StringRef::StringRef(&local_690,"static_cast<unsigned>(type(2u) & a) == 2u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_690,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1da;
    Catch::StringRef::StringRef(&local_6a0,"static_cast<unsigned>(a) == 2u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6a0,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1dc;
    Catch::StringRef::StringRef(&local_6b0,"static_cast<unsigned>(a ^ type(3u)) == 1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6b0,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1dd;
    Catch::StringRef::StringRef(&local_6c0,"static_cast<unsigned>(type(3u) ^ a) == 1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6c0,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1df;
    Catch::StringRef::StringRef(&local_6d0,"static_cast<unsigned>(a) == 1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6d0,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1e1;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"bitshift","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1ea;
    Catch::StringRef::StringRef(&local_6e0,"static_cast<unsigned>(a << 1u) == 2u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6e0,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1ec;
    Catch::StringRef::StringRef(&local_6f0,"static_cast<unsigned>(a) == 2u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_6f0,Normal);
    local_b98._0_4_ = 2;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1ee;
    Catch::StringRef::StringRef(&local_700,"static_cast<unsigned>(a >> 1u) == 1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_700,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1f0;
    Catch::StringRef::StringRef(&local_710,"static_cast<unsigned>(a) == 1u");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_710,Normal);
    local_b98._0_4_ = 1;
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._0_2_ = 0x101;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022fcf0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x1f2;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"dereference","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])((ulong)local_b98 & 0xffffffff00000000);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x1ff;
    Catch::StringRef::StringRef(&local_720,"(*a).a == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_720,Normal);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x200;
    Catch::StringRef::StringRef(&local_730,"a->a == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_730,Normal);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x202;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"array subscript","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_b98 = (undefined1  [8])0x100000000;
    local_b90._0_4_ = 2;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x20c;
    Catch::StringRef::StringRef(&local_740,"a[0] == 0");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_740,Normal);
    local_b68._vptr_ITransientExpression =
         (_func_int **)((ulong)local_b68._vptr_ITransientExpression & 0xffffffff00000000);
    uVar4 = local_b98._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 0;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = local_b98;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x20d;
    Catch::StringRef::StringRef(&local_750,"a[1] == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_750,Normal);
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,1);
    uVar4 = local_b98._4_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 1;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = local_b98 + 4;
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x20e;
    Catch::StringRef::StringRef(&local_760,"a[2] == 2");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_760,Normal);
    local_b68._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_b68._vptr_ITransientExpression._4_4_,2);
    uVar4 = local_b90._0_4_;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = uVar4 == 2;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = (ITransientExpression *)(local_b98 + 8);
    local_c10._M_p = (pointer)&local_b68;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x210;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"iterator","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != &local_b48.name.field_2) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    puVar3 = local_b98 + 4;
    local_b98 = (undefined1  [8])0x100000000;
    local_b90._0_4_ = 2;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x21c;
    local_b68._vptr_ITransientExpression = (_func_int **)puVar3;
    Catch::StringRef::StringRef(&local_770,"a == type(&arr[1])");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_770,Normal);
    pp_Var5 = local_b68._vptr_ITransientExpression;
    local_9d0._vptr_ITransientExpression = (_func_int **)puVar3;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = pp_Var5 == (_func_int **)puVar3;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230830;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_b68._vptr_ITransientExpression =
         (_func_int **)((long)local_b68._vptr_ITransientExpression + -4);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x21f;
    Catch::StringRef::StringRef(&local_780,"a == type(&arr[0])");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_780,Normal);
    pp_Var5 = local_b68._vptr_ITransientExpression;
    local_9d0._vptr_ITransientExpression = (_func_int **)local_b98;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = pp_Var5 == (_func_int **)local_b98;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230830;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_b68._vptr_ITransientExpression = local_b68._vptr_ITransientExpression + 1;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x223;
    Catch::StringRef::StringRef(&local_790,"a == type(&arr[2])");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_790,Normal);
    pp_Var5 = local_b68._vptr_ITransientExpression;
    local_9d0._vptr_ITransientExpression = (_func_int **)(local_b98 + 8);
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = pp_Var5 == (_func_int **)(local_b98 + 8);
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230830;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_b68._vptr_ITransientExpression =
         (_func_int **)((long)local_b68._vptr_ITransientExpression + -4);
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x226;
    Catch::StringRef::StringRef(&local_7a0,"a == type(&arr[1])");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_7a0,Normal);
    pp_Var5 = local_b68._vptr_ITransientExpression;
    local_9d0._vptr_ITransientExpression = (_func_int **)puVar3;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = pp_Var5 == (_func_int **)puVar3;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230830;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_b68;
    local_c10._M_p = (pointer)&local_9d0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x228;
    Catch::StringRef::StringRef(&local_7b0,"a - type(&arr[0]) == 1");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_7b0,Normal);
    lVar11 = (long)local_b68._vptr_ITransientExpression - (long)local_b98;
    local_9d0._vptr_ITransientExpression = (_func_int **)(lVar11 >> 2);
    local_9bc._0_4_ = 1;
    Catch::StringRef::StringRef((StringRef *)&local_c80,"==");
    local_c30._1_1_ = lVar11 == 4;
    local_c30._0_1_ = true;
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002308f0;
    local_c28._8_8_ = local_c80.m_assertionInfo.macroName.m_start;
    local_c28._16_8_ = local_c80.m_assertionInfo.macroName.m_size;
    local_c28._0_8_ = &local_9d0;
    local_c10._M_p = (pointer)local_9bc;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  paVar9 = &local_b48.name.field_2;
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x22a;
  local_b48.name._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"i/o","");
  Catch::SectionInfo::SectionInfo
            ((SectionInfo *)local_9b0,(SourceLineInfo *)&local_c80,&local_b48.name);
  Catch::Section::Section((Section *)local_c38,(SectionInfo *)local_9b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._32_8_ != local_980) {
    operator_delete((void *)local_9b0._32_8_,local_980[0]._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_9b0._0_8_ != local_9b0 + 0x10) {
    operator_delete((void *)local_9b0._0_8_,local_9b0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_c38);
  if (bVar7) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_b48);
    pSVar1 = &local_c80.m_assertionInfo.lineInfo;
    local_c80.m_assertionInfo.macroName.m_start = (char *)pSVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c80,"1","");
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_9b0,(string *)&local_c80,_S_in);
    if ((SourceLineInfo *)local_c80.m_assertionInfo.macroName.m_start != pSVar1) {
      operator_delete(local_c80.m_assertionInfo.macroName.m_start,
                      (ulong)(local_c80.m_assertionInfo.lineInfo.file + 1));
    }
    local_9bc._0_4_ = 0;
    std::ostream::operator<<(&local_b48,0);
    local_b98 = (undefined1  [8])0x1e496b;
    local_b90 = (undefined1  [8])0x7;
    local_b68._vptr_ITransientExpression = (_func_int **)0x1ec017;
    local_b68.m_isBinaryExpression = true;
    local_b68.m_result = true;
    local_b68._10_6_ = 0;
    Catch::StringRef::StringRef(&local_7c0,"out.str() == \"0\"");
    Catch::AssertionHandler::AssertionHandler
              (&local_c80,(StringRef *)local_b98,(SourceLineInfo *)&local_b68,local_7c0,Normal);
    std::__cxx11::stringbuf::str();
    iVar8 = std::__cxx11::string::compare((char *)&local_b68);
    Catch::StringRef::StringRef((StringRef *)&local_9d0,"==");
    local_b90[1] = iVar8 == 0;
    local_b90[0] = true;
    local_b98 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f608;
    local_b80 = local_9d0._vptr_ITransientExpression;
    bStack_b78 = local_9d0.m_isBinaryExpression;
    bStack_b77 = local_9d0.m_result;
    uStack_b76 = local_9d0._10_6_;
    local_b70 = "0";
    local_b88 = &local_b68;
    Catch::AssertionHandler::handleExpr(&local_c80,(ITransientExpression *)local_b98);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b98);
    if (local_b68._vptr_ITransientExpression != local_b58) {
      operator_delete(local_b68._vptr_ITransientExpression,(ulong)(local_b58[0] + 1));
    }
    Catch::AssertionHandler::complete(&local_c80);
    if (local_c80.m_completed == false) {
      (*(local_c80.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
    std::istream::operator>>((istream *)local_9b0,(int *)local_9bc);
    local_b98 = (undefined1  [8])0x1e496b;
    local_b90 = (undefined1  [8])0x7;
    local_b68._vptr_ITransientExpression = (_func_int **)0x1ec017;
    local_b68.m_isBinaryExpression = true;
    local_b68.m_result = true;
    local_b68._10_6_ = 0;
    Catch::StringRef::StringRef(&local_7d0,"static_cast<int>(a) == 1");
    Catch::AssertionHandler::AssertionHandler
              (&local_c80,(StringRef *)local_b98,(SourceLineInfo *)&local_b68,local_7d0,Normal);
    uVar4 = local_9bc._0_4_;
    local_9d0._vptr_ITransientExpression =
         (_func_int **)CONCAT44(local_9d0._vptr_ITransientExpression._4_4_,local_9bc._0_4_);
    local_9b4[0] = true;
    local_9b4[1] = false;
    local_9b4[2] = 0;
    local_9b4[3] = 0;
    Catch::StringRef::StringRef((StringRef *)&local_b68,"==");
    local_b90[1] = uVar4 == 1;
    local_b90[0] = true;
    local_b98 = (undefined1  [8])&PTR_streamReconstructedExpression_0022f648;
    local_b80 = local_b68._vptr_ITransientExpression;
    bStack_b78 = local_b68.m_isBinaryExpression;
    bStack_b77 = local_b68.m_result;
    uStack_b76 = local_b68._10_6_;
    local_b88 = &local_9d0;
    local_b70 = local_9b4;
    Catch::AssertionHandler::handleExpr(&local_c80,(ITransientExpression *)local_b98);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b98);
    Catch::AssertionHandler::complete(&local_c80);
    if (local_c80.m_completed == false) {
      (*(local_c80.m_resultCapture)->_vptr_IResultCapture[0xe])();
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_9b0);
    std::ios_base::~ios_base(local_938);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_b48);
    std::ios_base::~ios_base(local_ad8);
  }
  paVar9 = &local_b48.name.field_2;
  Catch::Section::~Section((Section *)local_c38);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x23d;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"explicit bool","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x245;
    Catch::StringRef::StringRef(&local_7e0,"!a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_7e0,Normal);
    local_c38[0] = 1;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_b98._0_4_ = 1;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x247;
    Catch::StringRef::StringRef(&local_7f0,"b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_7f0,Normal);
    local_c28._0_8_ = local_b98;
    local_c30 = (pointer)((ulong)CONCAT61(local_c30._2_6_,local_b98._0_4_ != 0) << 8);
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_00230870;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x249;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c38,"explicit bool nonconstexpr","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x25b;
    Catch::StringRef::StringRef(&local_800,"!a");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_800,Normal);
    local_c38[0] = 1;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_b98[0] = 1;
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x25d;
    Catch::StringRef::StringRef(&local_810,"b");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_810,Normal);
    local_c28._0_8_ = local_b98;
    local_c30 = (pointer)((ulong)CONCAT61(local_c30._2_6_,local_b98[0]) << 8);
    local_c38 = (undefined1  [8])&PTR_streamReconstructedExpression_002308b0;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)&local_b48,(ITransientExpression *)local_c38);
    Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  local_c80.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
  ;
  local_c80.m_assertionInfo.macroName.m_size = 0x25f;
  local_c38 = (undefined1  [8])local_c28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c38,"is_strong_typedef","");
  Catch::SectionInfo::SectionInfo(&local_b48,(SourceLineInfo *)&local_c80,(string *)local_c38);
  Catch::Section::Section((Section *)local_9b0,&local_b48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.description._M_dataplus._M_p != &local_b48.description.field_2) {
    operator_delete(local_b48.description._M_dataplus._M_p,
                    local_b48.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48.name._M_dataplus._M_p != paVar9) {
    operator_delete(local_b48.name._M_dataplus._M_p,local_b48.name.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_c38 != (undefined1  [8])local_c28) {
    operator_delete((void *)local_c38,(ulong)(local_c28._0_8_ + 1));
  }
  bVar7 = Catch::Section::operator_cast_to_bool((Section *)local_9b0);
  if (bVar7) {
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x266;
    Catch::StringRef::StringRef(&local_820,"is_strong_typedef<strong>::value");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_820,Normal);
    local_c38[0] = 1;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
    local_c38 = (undefined1  [8])0x1e496b;
    local_c30 = (pointer)0x7;
    local_c80.m_assertionInfo.macroName.m_start =
         "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/strong_typedef.cpp"
    ;
    local_c80.m_assertionInfo.macroName.m_size = 0x267;
    Catch::StringRef::StringRef(&local_830,"!is_strong_typedef<int>::value");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)&local_b48,(StringRef *)local_c38,(SourceLineInfo *)&local_c80,
               local_830,Normal);
    local_c38[0] = 1;
    Catch::AssertionHandler::handleExpr<bool>
              ((AssertionHandler *)&local_b48,(ExprLhs<bool> *)local_c38);
    Catch::AssertionHandler::complete((AssertionHandler *)&local_b48);
    if (local_b48.description.field_2._M_local_buf[10] == '\0') {
      (**(code **)(*(long *)local_b48.lineInfo.file + 0x70))();
    }
  }
  Catch::Section::~Section((Section *)local_9b0);
  return;
}

Assistant:

virtual ~base() = default;